

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void luaS_resize(lua_State *L,int newsize)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  global_State *pgVar3;
  GCObject **__s;
  long lVar4;
  int iVar5;
  GCObject *pGVar6;
  ulong uVar7;
  long lVar8;
  
  if (L->l_G->gcstate != '\x02') {
    if (newsize < -1) {
      luaG_runerror(L,"memory allocation error: block too big");
    }
    __s = (GCObject **)luaM_realloc_(L,(void *)0x0,0,(long)newsize * 8);
    pgVar1 = L->l_G;
    if (0 < newsize) {
      memset(__s,0,(ulong)(uint)newsize << 3);
    }
    iVar5 = (pgVar1->strt).size;
    lVar8 = (long)iVar5;
    if (0 < lVar8) {
      lVar4 = 0;
      do {
        pGVar6 = (pgVar1->strt).hash[lVar4];
        if (pGVar6 != (GCObject *)0x0) {
          do {
            pGVar2 = (pGVar6->gch).next;
            uVar7 = (long)*(int *)((long)pGVar6 + 0xc) & (long)newsize - 1U;
            (pGVar6->gch).next = __s[uVar7];
            __s[uVar7] = pGVar6;
            pGVar6 = pGVar2;
          } while (pGVar2 != (GCObject *)0x0);
          iVar5 = (pgVar1->strt).size;
        }
        lVar4 = lVar4 + 1;
        lVar8 = (long)iVar5;
      } while (lVar4 < lVar8);
    }
    pgVar3 = L->l_G;
    (*pgVar3->frealloc)(pgVar3->ud,(pgVar1->strt).hash,lVar8 * 8,0);
    pgVar3->totalbytes = pgVar3->totalbytes + lVar8 * -8;
    (pgVar1->strt).size = newsize;
    (pgVar1->strt).hash = __s;
  }
  return;
}

Assistant:

static void luaS_resize(lua_State*L,int newsize){
GCObject**newhash;
stringtable*tb;
int i;
if(G(L)->gcstate==2)
return;
newhash=luaM_newvector(L,newsize,GCObject*);
tb=&G(L)->strt;
for(i=0;i<newsize;i++)newhash[i]=NULL;
for(i=0;i<tb->size;i++){
GCObject*p=tb->hash[i];
while(p){
GCObject*next=p->gch.next;
unsigned int h=gco2ts(p)->hash;
int h1=lmod(h,newsize);
p->gch.next=newhash[h1];
newhash[h1]=p;
p=next;
}
}
luaM_freearray(L,tb->hash,tb->size,TString*);
tb->size=newsize;
tb->hash=newhash;
}